

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

char * zmq::mechanism_t::socket_type_string(int socket_type_)

{
  if (0x14 < (uint)socket_type_) {
    socket_type_string();
  }
  return _ZZN3zmq11mechanism_t18socket_type_stringEiE5names_rel +
         *(int *)(_ZZN3zmq11mechanism_t18socket_type_stringEiE5names_rel + (long)socket_type_ * 4);
}

Assistant:

const char *zmq::mechanism_t::socket_type_string (int socket_type_)
{
    // TODO the order must of the names must correspond to the values resp. order of ZMQ_* socket type definitions in zmq.h!
    static const char *names[] = {socket_type_pair,   socket_type_pub,
                                  socket_type_sub,    socket_type_req,
                                  socket_type_rep,    socket_type_dealer,
                                  socket_type_router, socket_type_pull,
                                  socket_type_push,   socket_type_xpub,
                                  socket_type_xsub,   socket_type_stream,
#ifdef ZMQ_BUILD_DRAFT_API
                                  socket_type_server, socket_type_client,
                                  socket_type_radio,  socket_type_dish,
                                  socket_type_gather, socket_type_scatter,
                                  socket_type_dgram,  socket_type_peer,
                                  socket_type_channel
#endif
    };
    static const size_t names_count = sizeof (names) / sizeof (names[0]);
    zmq_assert (socket_type_ >= 0
                && socket_type_ < static_cast<int> (names_count));
    return names[socket_type_];
}